

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::calcIndicators(AbstractScrollAreaPrivate *this)

{
  ScrollIndicator *pSVar1;
  
  if ((0 < (this->scrolledAreaSize).wd) && (0 < (this->scrolledAreaSize).ht)) {
    pSVar1 = this->horIndicator;
    calcIndicator(this,Horizontal,pSVar1->minimumSize,pSVar1->width,&pSVar1->needPaint,&pSVar1->size
                  ,&pSVar1->pos);
    QWidget::move((QPoint *)this->horIndicator);
    pSVar1 = this->horIndicator;
    QWidget::resize(&pSVar1->super_QWidget,pSVar1->size,pSVar1->width);
    pSVar1 = this->vertIndicator;
    calcIndicator(this,Vertical,pSVar1->minimumSize,pSVar1->width,&pSVar1->needPaint,&pSVar1->size,
                  &pSVar1->pos);
    QWidget::move((QPoint *)this->vertIndicator);
    pSVar1 = this->vertIndicator;
    QWidget::resize(&pSVar1->super_QWidget,pSVar1->width,pSVar1->size);
    return;
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::calcIndicators()
{
	if( scrolledAreaSize.isValid() && scrolledAreaSize.width() != 0
		&& scrolledAreaSize.height() != 0 )
	{
		calcIndicator( Qt::Horizontal, horIndicator->minimumSize,
			horIndicator->width, horIndicator->needPaint,
			horIndicator->size, horIndicator->pos );

		horIndicator->move( horIndicator->pos );
		horIndicator->resize( horIndicator->size, horIndicator->width );

		calcIndicator( Qt::Vertical, vertIndicator->minimumSize,
			vertIndicator->width, vertIndicator->needPaint,
			vertIndicator->size, vertIndicator->pos );

		vertIndicator->move( vertIndicator->pos );
		vertIndicator->resize( vertIndicator->width, vertIndicator->size );
	}
}